

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

void cvui::render::rect(cvui_block_t *theBlock,Rect *thePos,uint theBorderColor,uint theFillingColor
                       )

{
  int iVar1;
  double *pdVar2;
  double dVar3;
  Rect_<int> local_270;
  _InputOutputArray local_260;
  Mat local_248 [96];
  _OutputArray local_1e8;
  Mat local_1d0 [96];
  _InputArray local_170;
  _InputArray local_158;
  undefined1 local_140 [16];
  Mat aOverlay;
  double aAlpha;
  Point_<int> local_c4;
  Rect_<int> local_bc;
  cv local_ac [8];
  Rect aClippedRect;
  Rect_<int> local_90;
  _InputOutputArray local_80;
  undefined1 local_61;
  undefined1 local_60 [7];
  bool aHasFilling;
  Scalar aFilling;
  Scalar aBorder;
  uint theFillingColor_local;
  uint theBorderColor_local;
  Rect *thePos_local;
  cvui_block_t *theBlock_local;
  
  internal::hexToScalar
            ((Scalar *)(aFilling.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3),
             theBorderColor);
  internal::hexToScalar((Scalar *)local_60,theFillingColor);
  pdVar2 = cv::Vec<double,_4>::operator[]((Vec<double,_4> *)local_60,3);
  local_61 = *pdVar2 != 255.0;
  if ((bool)local_61) {
    pdVar2 = cv::Vec<double,_4>::operator[]((Vec<double,_4> *)local_60,3);
    if ((*pdVar2 != 0.0) || (NAN(*pdVar2))) {
      cv::Point_<int>::Point_(&local_c4,0,0);
      cv::MatSize::operator()((MatSize *)((long)&aAlpha + 4));
      cv::Rect_<int>::Rect_(&local_bc,&local_c4,(Size_<int> *)((long)&aAlpha + 4));
      cv::operator&(local_ac,thePos,&local_bc);
      pdVar2 = cv::Vec<double,_4>::operator[]((Vec<double,_4> *)local_60,3);
      dVar3 = *pdVar2 / -255.0 + 1.0;
      cv::Rect_<int>::size((Rect_<int> *)local_140);
      iVar1 = cv::Mat::type(&theBlock->where);
      cv::Mat::Mat((Mat *)(local_140 + 8),(Rect_<int> *)local_140,iVar1,(Vec<double,_4> *)local_60);
      cv::_InputArray::_InputArray(&local_158,(Mat *)(local_140 + 8));
      cv::Mat::operator()(local_1d0,(Rect *)theBlock);
      cv::_InputArray::_InputArray(&local_170,local_1d0);
      cv::Mat::operator()(local_248,(Rect *)theBlock);
      cv::_OutputArray::_OutputArray(&local_1e8,local_248);
      cv::addWeighted(&local_158,dVar3,&local_170,1.0 - dVar3,0.0,&local_1e8,-1);
      cv::_OutputArray::~_OutputArray(&local_1e8);
      cv::Mat::~Mat(local_248);
      cv::_InputArray::~_InputArray(&local_170);
      cv::Mat::~Mat(local_1d0);
      cv::_InputArray::~_InputArray(&local_158);
      cv::Mat::~Mat((Mat *)(local_140 + 8));
    }
    else {
      cv::_InputOutputArray::_InputOutputArray(&local_80,&theBlock->where);
      cv::Rect_<int>::Rect_(&local_90,thePos);
      cv::rectangle(&local_80,&local_90,local_60,0xffffffff,0x10,0);
      cv::_InputOutputArray::~_InputOutputArray(&local_80);
    }
  }
  cv::_InputOutputArray::_InputOutputArray(&local_260,&theBlock->where);
  cv::Rect_<int>::Rect_(&local_270,thePos);
  cv::rectangle(&local_260,&local_270,aFilling.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3
                ,1,0x10,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_260);
  return;
}

Assistant:

void rect(cvui_block_t& theBlock, cv::Rect& thePos, unsigned int theBorderColor, unsigned int theFillingColor) {
		cv::Scalar aBorder = internal::hexToScalar(theBorderColor);
		cv::Scalar aFilling = internal::hexToScalar(theFillingColor);

		bool aHasFilling = aFilling[3] != 0xff;

		if (aHasFilling) {
			if (aFilling[3] == 0x00) {
				// full opacity
				cv::rectangle(theBlock.where, thePos, aFilling, CVUI_FILLED, CVUI_ANTIALISED);
			} else {
				cv::Rect aClippedRect = thePos & cv::Rect(cv::Point(0, 0), theBlock.where.size());
				double aAlpha = 1.00 - static_cast<double>(aFilling[3]) / 255;
				cv::Mat aOverlay(aClippedRect.size(), theBlock.where.type(), aFilling);
				cv::addWeighted(aOverlay, aAlpha, theBlock.where(aClippedRect), 1.00 - aAlpha, 0.0, theBlock.where(aClippedRect));
			}
		}

		// Render the border
		cv::rectangle(theBlock.where, thePos, aBorder, 1, CVUI_ANTIALISED);
	}